

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

void EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *elements,
               _func_bool_NodeEvictionCandidate_ptr_NodeEvictionCandidate_ptr *comparator,size_t k,
               function<bool_(const_NodeEvictionCandidate_&)> *predicate)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  _Var3;
  long in_FS_OFFSET;
  function<bool_(const_NodeEvictionCandidate_&)> in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  __sort<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>>
            ((elements->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (elements->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_NodeEvictionCandidate_&,_const_NodeEvictionCandidate_&)>
              )comparator);
  _Var3._M_current =
       (elements->super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)_Var3._M_current -
          (long)(elements->
                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x48;
  if (uVar2 < k) {
    k = uVar2;
  }
  std::function<bool_(const_NodeEvictionCandidate_&)>::function
            ((function<bool_(const_NodeEvictionCandidate_&)> *)&stack0xffffffffffffffb0,predicate);
  _Var3 = std::
          remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,std::function<bool(NodeEvictionCandidate_const&)>>
                    (_Var3._M_current + -k,_Var3,in_stack_ffffffffffffffa8);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::erase
            (elements,(const_iterator)_Var3._M_current,
             (elements->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void EraseLastKElements(
    std::vector<T>& elements, Comparator comparator, size_t k,
    std::function<bool(const NodeEvictionCandidate&)> predicate = [](const NodeEvictionCandidate& n) { return true; })
{
    std::sort(elements.begin(), elements.end(), comparator);
    size_t eraseSize = std::min(k, elements.size());
    elements.erase(std::remove_if(elements.end() - eraseSize, elements.end(), predicate), elements.end());
}